

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O2

void __thiscall
GraphicBoard::createTiles(GraphicBoard *this,QImage *image,size_t boardSize,size_t tileSize)

{
  EVP_PKEY_CTX *src;
  uint uVar1;
  vector<QImage,_std::allocator<QImage>_> *this_00;
  EVP_PKEY_CTX *pEVar2;
  size_t tileSize_local;
  Format local_48 [6];
  
  pEVar2 = (EVP_PKEY_CTX *)(tileSize * boardSize);
  this_00 = &this->images;
  tileSize_local = tileSize;
  std::vector<QImage,_std::allocator<QImage>_>::reserve(this_00,boardSize * boardSize);
  for (uVar1 = 0; (EVP_PKEY_CTX *)(ulong)uVar1 < pEVar2; uVar1 = uVar1 + (int)tileSize) {
    src = (EVP_PKEY_CTX *)0x0;
    while( true ) {
      if ((pEVar2 <= src) ||
         (pEVar2 + -tileSize == src && pEVar2 + -tileSize == (EVP_PKEY_CTX *)(ulong)uVar1)) break;
      QImage::copy((QImage *)local_48,(EVP_PKEY_CTX *)image,src);
      std::vector<QImage,_std::allocator<QImage>_>::emplace_back<QImage>(this_00,(QImage *)local_48)
      ;
      QImage::~QImage((QImage *)local_48);
      src = (EVP_PKEY_CTX *)(ulong)(uint)((int)src + (int)tileSize);
    }
  }
  local_48[0] = Format_RGB32;
  std::vector<QImage,std::allocator<QImage>>::
  emplace_back<unsigned_long&,unsigned_long&,QImage::Format>
            ((vector<QImage,std::allocator<QImage>> *)this_00,&tileSize_local,&tileSize_local,
             local_48);
  QImage::fill((int)(this->images).super__Vector_base<QImage,_std::allocator<QImage>_>._M_impl.
                    super__Vector_impl_data._M_finish - (darkCyan|green));
  Message::putMessage(GRAPHIC_LOAD_OK,boardSize);
  return;
}

Assistant:

void GraphicBoard::createTiles( QImage& image, size_t boardSize, size_t tileSize )
{
    size_t pictureSize = boardSize * tileSize;
    images.reserve( boardSize * boardSize );

    for ( uint yPos = 0; yPos < pictureSize; yPos += tileSize )
    {
        for ( uint xPos = 0; xPos < pictureSize; xPos += tileSize )
        {
            if (( yPos == pictureSize - tileSize ) && ( xPos == pictureSize - tileSize ))
            {
                break;
            }
            images.emplace_back( image.copy( xPos, yPos, tileSize, tileSize ));
        }
    }

    images.emplace_back( tileSize, tileSize, QImage::Format_RGB32 );
    images.back().fill( Qt::GlobalColor::white );
    Message::putMessage( Result::GRAPHIC_LOAD_OK, boardSize );
}